

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O3

bool __thiscall IceCore::Container::DeleteKeepingOrder(Container *this,udword entry)

{
  udword *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar4 = (ulong)this->mCurNbEntries;
  if (uVar4 == 0) {
    return false;
  }
  puVar1 = this->mEntries;
  if (*puVar1 == entry) {
    bVar7 = true;
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    do {
      if (uVar4 - 1 == uVar6) {
        return false;
      }
      uVar5 = uVar6 + 1;
      lVar2 = uVar6 + 1;
      uVar6 = uVar5;
    } while (puVar1[lVar2] != entry);
    bVar7 = uVar5 < uVar4;
  }
  uVar3 = this->mCurNbEntries - 1;
  this->mCurNbEntries = uVar3;
  if ((uint)uVar5 < uVar3) {
    do {
      puVar1[uVar5] = puVar1[uVar5 + 1];
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->mCurNbEntries);
  }
  return bVar7;
}

Assistant:

bool Container::DeleteKeepingOrder(udword entry)
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			// Entry has been found at index i.
			// Shift entries to preserve order. You really should use a linked list instead.
			mCurNbEntries--;
			for(udword j=i;j<mCurNbEntries;j++)
			{
				mEntries[j] = mEntries[j+1];
			}
			return true;
		}
	}
	return false;
}